

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::EnhancedLayouts::XFBVariableStrideTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBVariableStrideTest *this,GLuint test_case_index,
          STAGES stage)

{
  STAGES SVar1;
  pointer ptVar2;
  GLuint GVar3;
  TestError *pTVar4;
  char *pcVar5;
  bool *text;
  char *pcVar6;
  bool *text_00;
  char *text_01;
  size_t position;
  GLchar buffer [16];
  size_t local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  GLchar *local_50;
  char local_48 [24];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  SVar1 = ptVar2[test_case_index].m_stage;
  if (SVar1 != stage) {
    switch(SVar1) {
    case VERTEX:
      pcVar6 = "";
      if (stage == FRAGMENT) {
        pcVar6 = 
        "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 any_fs;\nout vec4 fs_out;\n\nvoid main()\n{\n    fs_out = any_fs;\n}\n\n"
        ;
      }
      goto LAB_008a6167;
    case TESS_CTRL:
      if (stage == FRAGMENT) {
LAB_008a615a:
        pcVar6 = 
        "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 any_fs;\nout vec4 fs_out;\n\nvoid main()\n{\n    fs_out = any_fs;\n}\n\n"
        ;
        goto LAB_008a6167;
      }
      if (stage == VERTEX) goto LAB_008a602c;
      break;
    case TESS_EVAL:
      if (stage - VERTEX < 5) {
        pcVar6 = (&PTR_anon_var_dwarf_19f18e_020d2358)[stage - VERTEX];
        goto LAB_008a6167;
      }
      break;
    case GEOMETRY:
      if (stage == VERTEX) {
LAB_008a602c:
        pcVar6 = 
        "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 in_vs;\nout vec4 vs_any;\n\nvoid main()\n{\n    vs_any = in_vs;\n}\n\n"
        ;
        goto LAB_008a6167;
      }
      if (stage == FRAGMENT) goto LAB_008a615a;
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x52bd);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pcVar6 = "";
LAB_008a6167:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
    return __return_storage_ptr__;
  }
  ptVar2 = ptVar2 + test_case_index;
  local_60 = 0;
  local_50 = Utils::Type::GetGLSLTypeName(&ptVar2->m_type);
  GVar3 = Utils::Type::GetTypeSize((ptVar2->m_type).m_basic_type);
  sprintf(local_48,"%d",(ulong)(GVar3 * (ptVar2->m_type).m_n_columns * (ptVar2->m_type).m_n_rows));
  if (ptVar2->m_case == VALID) {
    text_01 = 
    "    gokuINDEX   = TYPE(1);\n    if (vec4(0) == result)\n    {\n        gokuINDEX   = TYPE(0);\n    }\n"
    ;
    pcVar6 = 
    "const uint type_size = SIZE;\n\nlayout (xfb_offset = 0, xfb_stride = 2 * type_size) out TYPE gokuARRAY;\n"
    ;
  }
  else {
    if (ptVar2->m_case != INVALID) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x525b);
      goto LAB_008a621e;
    }
    text_01 = 
    "    gokuINDEX   = TYPE(1);\n    vegetaINDEX = TYPE(0);\n    if (vec4(0) == result)\n    {\n        gokuINDEX   = TYPE(0);\n        vegetaINDEX = TYPE(1);\n    }\n"
    ;
    pcVar6 = 
    "const uint type_size = SIZE;\n\nlayout (xfb_offset = 0, xfb_stride = 2 * type_size) out TYPE gokuARRAY;\nlayout (xfb_offset = type_size)                     out TYPE vegetaARRAY;\n"
    ;
  }
  switch(stage) {
  case VERTEX:
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x1a17113);
    text_00 = ::glcts::fixed_sample_locations_values + 1;
    text = ::glcts::fixed_sample_locations_values + 1;
    goto LAB_008a60b0;
  case TESS_CTRL:
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x1a16dde);
    text = (bool *)0x1bfcbcf;
    text_00 = (bool *)0x1a832bc;
    goto LAB_008a60b0;
  case TESS_EVAL:
    pcVar5 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nlayout(isolines, point_mode) in;\n\nVAR_DEFINITION\nin  vec4 tcs_tes[];\nout vec4 any_fs;\n\nvoid main()\n{\n    vec4 result = tcs_tes[0];\n\nVARIABLE_USE\n    any_fs = result;\n}\n\n"
    ;
    break;
  case GEOMETRY:
    pcVar5 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nVAR_DEFINITION\nin  vec4 vs_any[];\nout vec4 any_fs;\n\nvoid main()\n{\n    vec4 result = vs_any[0];\n\nVARIABLE_USE\n    any_fs = result;\n    gl_Position  = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    any_fs = result;\n    gl_Position  = vec4(-1, 1, 0, 1);\n    EmitVertex();\n    any_fs = result;\n    gl_Position  = vec4(1, -1, 0, 1);\n    EmitVertex();\n    any_fs = result;\n    gl_Position  = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
    ;
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x5273);
LAB_008a621e:
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar5);
  text = (bool *)0x1bfcbcf;
  text_00 = (bool *)0x1a217ec;
LAB_008a60b0:
  Utils::replaceToken("VAR_DEFINITION",&local_60,pcVar6,__return_storage_ptr__);
  local_60 = 0;
  Utils::replaceToken("SIZE",&local_60,local_48,__return_storage_ptr__);
  Utils::replaceToken("ARRAY",&local_60,text,__return_storage_ptr__);
  if (ptVar2->m_case == INVALID) {
    Utils::replaceToken("ARRAY",&local_60,text,__return_storage_ptr__);
  }
  Utils::replaceToken("VARIABLE_USE",&local_60,text_01,__return_storage_ptr__);
  Utils::replaceAllTokens("TYPE",local_50,__return_storage_ptr__);
  Utils::replaceAllTokens("INDEX",text_00,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBVariableStrideTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* invalid_var_definition =
		"const uint type_size = SIZE;\n"
		"\n"
		"layout (xfb_offset = 0, xfb_stride = 2 * type_size) out TYPE gokuARRAY;\n"
		"layout (xfb_offset = type_size)                     out TYPE vegetaARRAY;\n";
	static const GLchar* valid_var_definition =
		"const uint type_size = SIZE;\n"
		"\n"
		"layout (xfb_offset = 0, xfb_stride = 2 * type_size) out TYPE gokuARRAY;\n";
	static const GLchar* invalid_use = "    gokuINDEX   = TYPE(1);\n"
									   "    vegetaINDEX = TYPE(0);\n"
									   "    if (vec4(0) == result)\n"
									   "    {\n"
									   "        gokuINDEX   = TYPE(0);\n"
									   "        vegetaINDEX = TYPE(1);\n"
									   "    }\n";
	static const GLchar* valid_use = "    gokuINDEX   = TYPE(1);\n"
									 "    if (vec4(0) == result)\n"
									 "    {\n"
									 "        gokuINDEX   = TYPE(0);\n"
									 "    }\n";
	static const GLchar* fs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 any_fs;\n"
							  "out vec4 fs_out;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    fs_out = any_fs;\n"
							  "}\n"
							  "\n";
	static const GLchar* gs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 vs_any[];\n"
									 "out vec4 any_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = vs_any[0];\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    any_fs = result;\n"
									 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    any_fs = result;\n"
									 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    any_fs = result;\n"
									 "    gl_Position  = vec4(1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    any_fs = result;\n"
									 "    gl_Position  = vec4(1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "}\n"
									 "\n";
	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "in  vec4 vs_any[];\n"
							   "out vec4 tcs_tes[];\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "\n"
							   "    tcs_tes[gl_InvocationID] = vs_any[gl_InvocationID];\n"
							   "\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";
	static const GLchar* tcs_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(vertices = 1) out;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 vs_any[];\n"
									  "out vec4 any_fs[];\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = vs_any[gl_InvocationID];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    any_fs[gl_InvocationID] = result;\n"
									  "\n"
									  "    gl_TessLevelOuter[0] = 1.0;\n"
									  "    gl_TessLevelOuter[1] = 1.0;\n"
									  "    gl_TessLevelOuter[2] = 1.0;\n"
									  "    gl_TessLevelOuter[3] = 1.0;\n"
									  "    gl_TessLevelInner[0] = 1.0;\n"
									  "    gl_TessLevelInner[1] = 1.0;\n"
									  "}\n"
									  "\n";
	static const GLchar* tes_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 tcs_tes[];\n"
									  "out vec4 any_fs;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = tcs_tes[0];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    any_fs = result;\n"
									  "}\n"
									  "\n";
	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 in_vs;\n"
							  "out vec4 vs_any;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    vs_any = in_vs;\n"
							  "}\n"
							  "\n";
	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 in_vs;\n"
									 "out vec4 any_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = in_vs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    any_fs = result;\n"
									 "}\n"
									 "\n";

	std::string source;
	testCase&   test_case = m_test_cases[test_case_index];

	if (test_case.m_stage == stage)
	{
		const GLchar* array = "";
		GLchar		  buffer[16];
		const GLchar* index	= "";
		size_t		  position = 0;
		size_t		  temp;
		const GLchar* type_name		 = test_case.m_type.GetGLSLTypeName();
		const GLchar* var_definition = 0;
		const GLchar* var_use		 = 0;

		sprintf(buffer, "%d", test_case.m_type.GetSize());

		switch (test_case.m_case)
		{
		case VALID:
			var_definition = valid_var_definition;
			var_use		   = valid_use;
			break;
		case INVALID:
			var_definition = invalid_var_definition;
			var_use		   = invalid_use;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			source = gs_tested;
			array  = "[1]";
			index  = "[0]";
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs_tested;
			array  = "[1]";
			index  = "[gl_InvocationID]";
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes_tested;
			array  = "[1]";
			index  = "[0]";
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		temp = position;
		Utils::replaceToken("VAR_DEFINITION", position, var_definition, source);
		position = temp;
		Utils::replaceToken("SIZE", position, buffer, source);
		Utils::replaceToken("ARRAY", position, array, source);
		if (INVALID == test_case.m_case)
		{
			Utils::replaceToken("ARRAY", position, array, source);
		}
		Utils::replaceToken("VARIABLE_USE", position, var_use, source);

		Utils::replaceAllTokens("TYPE", type_name, source);
		Utils::replaceAllTokens("INDEX", index, source);
	}
	else
	{
		switch (test_case.m_stage)
		{
		case Utils::Shader::GEOMETRY:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_CTRL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_EVAL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::TESS_CTRL:
				source = tcs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::VERTEX:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			default:
				source = "";
			}
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}

	return source;
}